

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____66>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____66> *this)

{
  long *plVar1;
  long in_RDI;
  ____C_A_T_C_H____T_E_S_T____66 obj;
  code *local_e8;
  long local_b8 [23];
  
  anon_unknown.dwarf_ae086::____C_A_T_C_H____T_E_S_T____66::____C_A_T_C_H____T_E_S_T____66
            ((____C_A_T_C_H____T_E_S_T____66 *)0x2ba046);
  local_e8 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_b8 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_e8 & 1) != 0) {
    local_e8 = *(code **)(local_e8 + *plVar1 + -1);
  }
  (*local_e8)(plVar1);
  anon_unknown.dwarf_ae086::____C_A_T_C_H____T_E_S_T____66::~____C_A_T_C_H____T_E_S_T____66
            ((____C_A_T_C_H____T_E_S_T____66 *)0x2ba0aa);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }